

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electromagnetic_Emission_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Electromagnetic_Emission_PDU::ClearEmissionSystem(Electromagnetic_Emission_PDU *this)

{
  pointer pEVar1;
  pointer pEVar2;
  pointer pEVar3;
  
  pEVar1 = (this->m_vEmissionSystem).
           super__Vector_base<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar2 = (this->m_vEmissionSystem).
           super__Vector_base<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pEVar3 = pEVar1;
  if (pEVar2 != pEVar1) {
    do {
      (**(pEVar3->super_DataTypeBase)._vptr_DataTypeBase)(pEVar3);
      pEVar3 = pEVar3 + 1;
    } while (pEVar3 != pEVar2);
    (this->m_vEmissionSystem).
    super__Vector_base<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>
    ._M_impl.super__Vector_impl_data._M_finish = pEVar1;
  }
  this->m_ui8NumberOfEmissionSystems = '\0';
  (this->super_Header).super_Header6.m_ui16PDULength = 0x1c;
  return;
}

Assistant:

void Electromagnetic_Emission_PDU::ClearEmissionSystem()
{
    m_vEmissionSystem.clear();
    m_ui8NumberOfEmissionSystems = 0;
    m_ui16PDULength = ELECTROMAGNETIC_EMISSION_PDU_SIZE;
}